

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

RsRuleSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  RsRuleSyntax *pRVar1;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index * 2);
  this_01 = TokenOrSyntax::node(this_00);
  pRVar1 = SyntaxNode::as<slang::syntax::RsRuleSyntax>(this_01);
  return pRVar1;
}

Assistant:

T* operator[](size_t index) {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }